

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O0

sqlid_t hiberlite::Database::allocId(shared_connection *c,string *table)

{
  int result;
  autoclosed_con *paVar1;
  sqlite3 *psVar2;
  char *zSql;
  database_error *this;
  sqlite3_int64 sVar3;
  shared_res<hiberlite::autoclosed_con> local_c0;
  int local_b0;
  int rc;
  string local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [8];
  string query;
  char *local_20;
  char *err_msg;
  string *table_local;
  shared_connection *c_local;
  
  local_20 = (char *)0x0;
  err_msg = (char *)table;
  table_local = (string *)c;
  std::operator+((char *)local_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"INSERT INTO "
                );
  std::operator+(local_80,(char *)local_a0);
  std::operator+(local_60,(char *)local_80);
  std::operator+(local_40,(char *)local_60);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string(local_a0);
  paVar1 = shared_res<hiberlite::autoclosed_con>::operator->(c);
  psVar2 = autoclosed_con::getSQLite3Ptr(paVar1);
  zSql = (char *)std::__cxx11::string::c_str();
  result = sqlite3_exec(psVar2,zSql,(sqlite3_callback)0x0,(void *)0x0,&local_20);
  local_b0 = result;
  if (local_20 != (char *)0x0) {
    this = (database_error *)__cxa_allocate_exception(0x10);
    database_error::database_error(this,local_20);
    __cxa_throw(this,&database_error::typeinfo,database_error::~database_error);
  }
  shared_res<hiberlite::autoclosed_con>::shared_res(&local_c0,c);
  database_error::database_assert(result,&local_c0);
  shared_res<hiberlite::autoclosed_con>::~shared_res(&local_c0);
  paVar1 = shared_res<hiberlite::autoclosed_con>::operator->(c);
  psVar2 = autoclosed_con::getSQLite3Ptr(paVar1);
  sVar3 = sqlite3_last_insert_rowid(psVar2);
  std::__cxx11::string::~string((string *)local_40);
  return sVar3;
}

Assistant:

sqlid_t Database::allocId(shared_connection c, std::string table)
{
	//THREAD critical call
	char* err_msg=NULL;
	std::string query="INSERT INTO "+table+" ("+HIBERLITE_PRIMARY_KEY_COLUMN+") VALUES (NULL);";
	HIBERLITE_HL_DBG_DO( std::cout << "exec: " << query << std::endl; )
	int rc=sqlite3_exec(c->getSQLite3Ptr(),query.c_str(),NULL, NULL, &err_msg );
	if(err_msg)
		throw database_error(err_msg);
	database_error::database_assert(rc, c);

	return sqlite3_last_insert_rowid(c->getSQLite3Ptr());
}